

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_ssg.h
# Opt level: O2

void __thiscall ymfm::ssg_engine::output(ssg_engine *this,output_data *output)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  byte bVar4;
  uint uVar5;
  ulong uVar6;
  
  bVar4 = (this->m_regs).m_regdata[0xd];
  uVar5 = this->m_envelope_state;
  if ((0x1f < uVar5 & (~(bVar4 >> 3) | bVar4)) == 1) {
    this->m_envelope_state = 0x20;
    uVar1 = 0x1f;
    if (((bVar4 >> 1 ^ bVar4 >> 2) & bVar4 >> 3 & 1) == 0) {
      uVar1 = 0;
    }
  }
  else {
    uVar3 = uVar5 >> 5 & 1;
    if ((bVar4 & 2) == 0) {
      uVar3 = 0;
    }
    uVar1 = 0x1f;
    if (uVar3 != ((bVar4 >> 2 & 1) != 0)) {
      uVar1 = 0;
    }
    uVar1 = uVar1 ^ uVar5 & 0x1f;
  }
  for (lVar2 = 0x38; lVar2 != 0x3b; lVar2 = lVar2 + 1) {
    bVar4 = (this->m_regs).m_regdata[7];
    if ((((uint)((bVar4 >> ((int)lVar2 - 0x35U & 0x1f) & 1) != 0) | this->m_noise_state) &
        ((uint)((bVar4 >> ((int)lVar2 - 0x38U & 0x1f) & 1) != 0) |
        *(uint *)((long)this + lVar2 * 4 + -0xcc))) == 0) {
      uVar6 = 0;
    }
    else {
      bVar4 = *(byte *)((long)this->m_tone_count + lVar2 + -8);
      uVar6 = (ulong)uVar1;
      if ((bVar4 & 0x10) == 0) {
        bVar4 = bVar4 * '\x02' & 0x1e;
        uVar5 = (uint)(byte)(bVar4 + 1);
        if (bVar4 == 0) {
          uVar5 = 0;
        }
        uVar6 = (ulong)uVar5;
      }
    }
    *(int *)((long)output + lVar2 * 4 + -0xe0) = (int)ssg_engine::output::s_amplitudes[uVar6];
  }
  return;
}

Assistant:

uint32_t envelope_hold() const                      { return bitfield(m_regdata[0x0d], 0); }